

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitRefTest(BinaryInstWriter *this,RefTest *curr)

{
  ulong uVar1;
  WasmBinaryWriter *this_00;
  Exactness exactness;
  HeapType type;
  
  BufferWithRandomAccess::operator<<(this->o,-5);
  uVar1 = (curr->castType).id;
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)((((uint)uVar1 & 3) == 2 && 6 < uVar1) | 0x14))
  ;
  this_00 = this->parent;
  type = wasm::Type::getHeapType(&curr->castType);
  exactness = wasm::Type::getExactness(&curr->castType);
  WasmBinaryWriter::writeHeapType(this_00,type,exactness);
  return;
}

Assistant:

void BinaryInstWriter::visitRefTest(RefTest* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  if (curr->castType.isNullable()) {
    o << U32LEB(BinaryConsts::RefTestNull);
  } else {
    o << U32LEB(BinaryConsts::RefTest);
  }
  parent.writeHeapType(curr->castType.getHeapType(),
                       curr->castType.getExactness());
}